

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O0

string * JoinStringPiece_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<StringPiece,_std::allocator<StringPiece>_> *list,char sep)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong local_48;
  size_t i_1;
  size_t i;
  size_t cap;
  allocator<char> local_1a;
  char local_19;
  vector<StringPiece,_std::allocator<StringPiece>_> *pvStack_18;
  char sep_local;
  vector<StringPiece,_std::allocator<StringPiece>_> *list_local;
  string *ret;
  
  local_19 = sep;
  pvStack_18 = list;
  list_local = (vector<StringPiece,_std::allocator<StringPiece>_> *)__return_storage_ptr__;
  bVar2 = std::vector<StringPiece,_std::allocator<StringPiece>_>::empty(list);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1a);
    std::allocator<char>::~allocator(&local_1a);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::vector<StringPiece,_std::allocator<StringPiece>_>::size(pvStack_18);
    for (i_1 = 0; sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size(pvStack_18),
        i_1 < sVar3; i_1 = i_1 + 1) {
      std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[](pvStack_18,i_1);
    }
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    for (local_48 = 0;
        sVar3 = std::vector<StringPiece,_std::allocator<StringPiece>_>::size(pvStack_18),
        local_48 < sVar3; local_48 = local_48 + 1) {
      if (local_48 != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_19);
      }
      pvVar4 = std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[]
                         (pvStack_18,local_48);
      pcVar1 = pvVar4->str_;
      std::vector<StringPiece,_std::allocator<StringPiece>_>::operator[](pvStack_18,local_48);
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string JoinStringPiece(const vector<StringPiece>& list, char sep) {
  if (list.empty()) {
    return "";
  }

  string ret;

  {
    size_t cap = list.size() - 1;
    for (size_t i = 0; i < list.size(); ++i) {
      cap += list[i].len_;
    }
    ret.reserve(cap);
  }

  for (size_t i = 0; i < list.size(); ++i) {
    if (i != 0) {
      ret += sep;
    }
    ret.append(list[i].str_, list[i].len_);
  }

  return ret;
}